

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

ByteCodeUsesInstr * __thiscall
Inline::EmitFixedMethodOrFunctionObjectChecksForBuiltIns
          (Inline *this,Instr *callInstr,Instr *funcObjCheckInsertInstr,
          FunctionJITTimeInfo *inlineeInfo,bool isPolymorphic,bool isBuiltIn,bool isCtor,
          bool isInlined)

{
  code *pcVar1;
  bool bVar2;
  StackSym *pSVar3;
  undefined4 *puVar4;
  FixedFieldInfo *this_00;
  intptr_t iVar5;
  intptr_t iVar6;
  ByteCodeUsesInstr *this_01;
  BailOutInstrTemplate<IR::Instr> *bailOutInstr;
  RegOpnd *funcOpnd;
  Inline *this_02;
  byte bVar7;
  bool local_32;
  byte local_31;
  
  pSVar3 = IR::Opnd::GetStackSym(callInstr->m_src1);
  local_31 = callInstr->m_src1->field_0xb;
  bVar2 = TryOptimizeCallInstrWithFixedMethod
                    (this,callInstr,inlineeInfo,isPolymorphic,isBuiltIn,isCtor,isInlined,&local_32,
                     false,0);
  if (bVar2) {
    if (callInstr->m_opcode != CallIFixed) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x11fc,"(callInstr->m_opcode == Js::OpCode::CallIFixed)",
                         "callInstr->m_opcode == Js::OpCode::CallIFixed");
      if (!bVar2) goto LAB_00507905;
      *puVar4 = 0;
    }
    this_00 = IR::Instr::GetFixedFunction(callInstr);
    iVar5 = FixedFieldInfo::GetFuncInfoAddr(this_00);
    iVar6 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeInfo);
    if (iVar5 != iVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x11fd,
                         "(callInstr->GetFixedFunction()->GetFuncInfoAddr() == inlineeInfo->GetFunctionInfoAddr())"
                         ,
                         "callInstr->GetFixedFunction()->GetFuncInfoAddr() == inlineeInfo->GetFunctionInfoAddr()"
                        );
      if (!bVar2) {
LAB_00507905:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar7 = local_31 & 8;
    this_01 = IR::ByteCodeUsesInstr::New(callInstr);
    IR::ByteCodeUsesInstr::SetRemovedOpndSymbol(this_01,(bool)(bVar7 >> 3),(pSVar3->super_Sym).m_id)
    ;
    IR::Instr::InsertBefore(callInstr,&this_01->super_Instr);
  }
  else {
    bailOutInstr = IR::BailOutInstrTemplate<IR::Instr>::New
                             (BailOnNotBuiltIn,BailOutOnInlineFunction,callInstr,callInstr->m_func);
    this_02 = (Inline *)callInstr->m_src1;
    funcOpnd = IR::Opnd::AsRegOpnd((Opnd *)this_02);
    InsertFunctionObjectCheck
              (this_02,funcOpnd,funcObjCheckInsertInstr,&bailOutInstr->super_Instr,inlineeInfo);
    this_01 = (ByteCodeUsesInstr *)0x0;
  }
  return this_01;
}

Assistant:

IR::ByteCodeUsesInstr*
Inline::EmitFixedMethodOrFunctionObjectChecksForBuiltIns(IR::Instr *callInstr, IR::Instr * funcObjCheckInsertInstr, const FunctionJITTimeInfo * inlineeInfo, bool isPolymorphic, bool isBuiltIn, bool isCtor, bool isInlined)
{
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    IR::ByteCodeUsesInstr * useCallTargetInstr = nullptr;
    bool safeThis = false;
    if (TryOptimizeCallInstrWithFixedMethod(callInstr, inlineeInfo, isPolymorphic, isBuiltIn, isCtor, isInlined, safeThis))
    {
        Assert(callInstr->m_opcode == Js::OpCode::CallIFixed);
        Assert(callInstr->GetFixedFunction()->GetFuncInfoAddr() == inlineeInfo->GetFunctionInfoAddr());
        // If we optimized the call instruction for a fixed function, we must extend the function object's lifetime until after the last bailout before the call.
        useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr);
        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetIsJITOpt, originalCallTargetStackSym->m_id);
        callInstr->InsertBefore(useCallTargetInstr);
    }
    else
    {
        IR::BailOutInstr * bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotBuiltIn, IR::BailOutOnInlineFunction, callInstr, callInstr->m_func);
        InsertFunctionObjectCheck(callInstr->GetSrc1()->AsRegOpnd(), funcObjCheckInsertInstr, bailOutInstr, inlineeInfo);
    }
    return useCallTargetInstr;
}